

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O3

void __thiscall testing::internal::GTestLog::~GTestLog(GTestLog *this)

{
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  if (this->severity_ != GTEST_FATAL) {
    return;
  }
  fflush(_stderr);
  abort();
}

Assistant:

GTestLog::~GTestLog() {
  GetStream() << ::std::endl;
  if (severity_ == GTEST_FATAL) {
    fflush(stderr);
    posix::Abort();
  }
}